

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shape.cpp
# Opt level: O1

void __thiscall sf::Shape::updateTexCoords(Shape *this)

{
  VertexArray *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  Vertex *pVVar6;
  size_t sVar7;
  float fVar8;
  float fVar9;
  
  iVar1 = (this->m_textureRect).left;
  iVar2 = (this->m_textureRect).top;
  iVar3 = (this->m_textureRect).width;
  iVar4 = (this->m_textureRect).height;
  this_00 = &this->m_vertices;
  sVar5 = VertexArray::getVertexCount(this_00);
  if (sVar5 != 0) {
    sVar5 = 0;
    do {
      fVar9 = 0.0;
      if (0.0 < (this->m_insideBounds).width) {
        pVVar6 = VertexArray::operator[](this_00,sVar5);
        fVar9 = ((pVVar6->position).x - (this->m_insideBounds).left) / (this->m_insideBounds).width;
      }
      fVar8 = 0.0;
      if (0.0 < (this->m_insideBounds).height) {
        pVVar6 = VertexArray::operator[](this_00,sVar5);
        fVar8 = ((pVVar6->position).y - (this->m_insideBounds).top) / (this->m_insideBounds).height;
      }
      pVVar6 = VertexArray::operator[](this_00,sVar5);
      (pVVar6->texCoords).x = fVar9 * (float)iVar3 + (float)iVar1;
      pVVar6 = VertexArray::operator[](this_00,sVar5);
      (pVVar6->texCoords).y = fVar8 * (float)iVar4 + (float)iVar2;
      sVar5 = sVar5 + 1;
      sVar7 = VertexArray::getVertexCount(this_00);
    } while (sVar5 < sVar7);
  }
  return;
}

Assistant:

void Shape::updateTexCoords()
{
    FloatRect convertedTextureRect = FloatRect(m_textureRect);

    for (std::size_t i = 0; i < m_vertices.getVertexCount(); ++i)
    {
        float xratio = m_insideBounds.width > 0 ? (m_vertices[i].position.x - m_insideBounds.left) / m_insideBounds.width : 0;
        float yratio = m_insideBounds.height > 0 ? (m_vertices[i].position.y - m_insideBounds.top) / m_insideBounds.height : 0;
        m_vertices[i].texCoords.x = convertedTextureRect.left + convertedTextureRect.width * xratio;
        m_vertices[i].texCoords.y = convertedTextureRect.top + convertedTextureRect.height * yratio;
    }
}